

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_seh.cpp
# Opt level: O2

void badCallInner_Nullptr(void)

{
  double __x;
  StackInfo si;
  
  nodecpp::log::default_log::info<char_const*>
            ("about to attempt to dereference a null pointer. Calling at ");
  nodecpp::StackInfo::StackInfo(&si,true);
  nodecpp::StackInfo::log(&si,__x);
  nodecpp::StackInfo::~StackInfo(&si);
  return;
}

Assistant:

void badCallInner_Nullptr()
{
	volatile int * ptr = nullptr;
#ifndef NODECPP_NO_STACK_INFO_IN_EXCEPTIONS
	nodecpp::log::default_log::info("about to attempt to dereference a null pointer. Calling at " );
	nodecpp::StackInfo si(true);
	si.log( nodecpp::log::LogLevel::fatal );
#endif // NODECPP_NO_STACK_INFO_IN_EXCEPTIONS
#if !defined NODECPP_CLANG // SEH implementation for clang is yet to be developed
    *ptr = 0;
#endif // NODECPP_CLANG
}